

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool c4::yml::anon_unknown_0::_is_scalar_next__rseq_rval(csubstr s)

{
  bool bVar1;
  int iVar2;
  size_t in_stack_00000018;
  char *in_stack_00000020;
  basic_substring<const_char> *in_stack_00000028;
  bool local_51;
  basic_substring<char_const> local_50 [16];
  basic_substring<char_const> local_40 [8];
  basic_substring<const_char> *in_stack_ffffffffffffffc8;
  ro_substr in_stack_ffffffffffffffd0;
  basic_substring<const_char> local_20;
  char *local_10;
  basic_substring<const_char> *local_8;
  
  basic_substring<char_const>::basic_substring<5ul>
            ((basic_substring<char_const> *)&stack0xffffffffffffffd0,(char (*) [5])"[{!&");
  bVar1 = basic_substring<const_char>::begins_with_any(&local_20,in_stack_ffffffffffffffd0);
  local_51 = true;
  if (!bVar1) {
    basic_substring<char_const>::basic_substring<3ul>(local_40,(char (*) [3])"? ");
    bVar1 = basic_substring<const_char>::begins_with
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    local_51 = true;
    if (!bVar1) {
      basic_substring<char_const>::basic_substring<3ul>(local_50,(char (*) [3])0x35d640);
      bVar1 = basic_substring<const_char>::begins_with
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
      local_51 = true;
      if (!bVar1) {
        local_8 = &local_20;
        local_10 = "-";
        iVar2 = basic_substring<const_char>::compare
                          (in_stack_00000028,in_stack_00000020,in_stack_00000018);
        local_51 = iVar2 == 0;
      }
    }
  }
  return (bool)((local_51 ^ 0xffU) & 1);
}

Assistant:

bool _is_scalar_next__rseq_rval(csubstr s)
{
    return !(s.begins_with_any("[{!&") || s.begins_with("? ") || s.begins_with("- ") || s == "-");
}